

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O0

void Gia_ManPrintStateEncoding(Vec_Vec_t *vCodes,int nBits)

{
  int iVar1;
  void *__s;
  Vec_Int_t *p;
  int local_30;
  int Bit;
  int k;
  int i;
  Vec_Int_t *vVec;
  char *pBuffer;
  int nBits_local;
  Vec_Vec_t *vCodes_local;
  
  __s = malloc((long)(nBits + 1));
  *(undefined1 *)((long)__s + (long)nBits) = 0;
  Bit = 0;
  do {
    iVar1 = Vec_VecSize(vCodes);
    if (iVar1 <= Bit) {
      if (__s != (void *)0x0) {
        free(__s);
      }
      return;
    }
    p = Vec_VecEntryInt(vCodes,Bit);
    printf("%6d : ",(ulong)(Bit + 1));
    memset(__s,0x2d,(long)nBits);
    for (local_30 = 0; iVar1 = Vec_IntSize(p), local_30 < iVar1; local_30 = local_30 + 1) {
      iVar1 = Vec_IntEntry(p,local_30);
      if (nBits <= iVar1) {
        __assert_fail("Bit < nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStg.c"
                      ,0x3b,"void Gia_ManPrintStateEncoding(Vec_Vec_t *, int)");
      }
      *(undefined1 *)((long)__s + (long)iVar1) = 0x31;
    }
    printf("%s\n",__s);
    Bit = Bit + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManPrintStateEncoding( Vec_Vec_t * vCodes, int nBits )
{
    char * pBuffer;
    Vec_Int_t * vVec;
    int i, k, Bit;
    pBuffer = ABC_ALLOC( char, nBits + 1 );
    pBuffer[nBits] = 0;
    Vec_VecForEachLevelInt( vCodes, vVec, i )
    {
        printf( "%6d : ", i+1 );
        memset( pBuffer, '-', nBits );
        Vec_IntForEachEntry( vVec, Bit, k )
        {
            assert( Bit < nBits );
            pBuffer[Bit] = '1';
        }
        printf( "%s\n", pBuffer );
    }
    ABC_FREE( pBuffer );
}